

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlIsID(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  int iVar1;
  xmlChar *local_88;
  xmlChar **local_80;
  xmlChar *aprefix;
  xmlChar *fullelemname;
  xmlChar felem [50];
  xmlAttributePtr attrDecl;
  xmlAttrPtr attr_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  
  if ((attr == (xmlAttrPtr)0x0) || (attr->name == (xmlChar *)0x0)) {
    return 0;
  }
  if ((doc == (xmlDocPtr)0x0) || (doc->type != XML_HTML_DOCUMENT_NODE)) {
    stack0xffffffffffffffd0 = (xmlAttributePtr)0x0;
    if ((attr->ns != (xmlNs *)0x0) &&
       (((attr->ns->prefix != (xmlChar *)0x0 &&
         (iVar1 = strcmp((char *)attr->name,"id"), iVar1 == 0)) &&
        (iVar1 = strcmp((char *)attr->ns->prefix,"xml"), iVar1 == 0)))) {
      return 1;
    }
    if ((doc == (xmlDocPtr)0x0) ||
       ((doc->intSubset == (_xmlDtd *)0x0 && (doc->extSubset == (_xmlDtd *)0x0)))) {
      return 0;
    }
    if (((elem == (xmlNodePtr)0x0) || (elem->type != XML_ELEMENT_NODE)) ||
       (elem->name == (xmlChar *)0x0)) {
      return 0;
    }
    if ((elem->ns == (xmlNs *)0x0) || (elem->ns->prefix == (xmlChar *)0x0)) {
      local_80 = (xmlChar **)elem->name;
    }
    else {
      local_80 = (xmlChar **)
                 xmlBuildQName(elem->name,elem->ns->prefix,(xmlChar *)&fullelemname,0x32);
    }
    if (local_80 == (xmlChar **)0x0) {
      return -1;
    }
    if (attr->ns == (xmlNs *)0x0) {
      local_88 = (xmlChar *)0x0;
    }
    else {
      local_88 = attr->ns->prefix;
    }
    if (((local_80 != (xmlChar **)0x0) &&
        (register0x00000000 =
              xmlGetDtdQAttrDesc(doc->intSubset,(xmlChar *)local_80,attr->name,local_88),
        register0x00000000 == (xmlAttributePtr)0x0)) && (doc->extSubset != (_xmlDtd *)0x0)) {
      register0x00000000 =
           xmlGetDtdQAttrDesc(doc->extSubset,(xmlChar *)local_80,attr->name,local_88);
    }
    if ((local_80 != &fullelemname) && (local_80 != (xmlChar **)elem->name)) {
      (*xmlFree)(local_80);
    }
    if ((stack0xffffffffffffffd0 != (xmlAttributePtr)0x0) &&
       (stack0xffffffffffffffd0->atype == XML_ATTRIBUTE_ID)) {
      return 1;
    }
  }
  else {
    iVar1 = xmlStrEqual("id",attr->name);
    if (iVar1 != 0) {
      return 1;
    }
    if ((elem == (xmlNodePtr)0x0) || (elem->type != XML_ELEMENT_NODE)) {
      return 0;
    }
    iVar1 = xmlStrEqual("name",attr->name);
    if ((iVar1 != 0) && (iVar1 = xmlStrEqual(elem->name,"a"), iVar1 != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int
xmlIsID(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if ((attr == NULL) || (attr->name == NULL))
        return(0);

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        if (xmlStrEqual(BAD_CAST "id", attr->name))
            return(1);

        if ((elem == NULL) || (elem->type != XML_ELEMENT_NODE))
            return(0);

        if ((xmlStrEqual(BAD_CAST "name", attr->name)) &&
	    (xmlStrEqual(elem->name, BAD_CAST "a")))
	    return(1);
    } else {
	xmlAttributePtr attrDecl = NULL;
	xmlChar felem[50];
	xmlChar *fullelemname;
        const xmlChar *aprefix;

        if ((attr->ns != NULL) && (attr->ns->prefix != NULL) &&
            (!strcmp((char *) attr->name, "id")) &&
            (!strcmp((char *) attr->ns->prefix, "xml")))
            return(1);

        if ((doc == NULL) ||
            ((doc->intSubset == NULL) && (doc->extSubset == NULL)))
            return(0);

        if ((elem == NULL) ||
            (elem->type != XML_ELEMENT_NODE) ||
            (elem->name == NULL))
            return(0);

	fullelemname = (elem->ns != NULL && elem->ns->prefix != NULL) ?
	    xmlBuildQName(elem->name, elem->ns->prefix, felem, 50) :
	    (xmlChar *)elem->name;
        if (fullelemname == NULL)
            return(-1);

        aprefix = (attr->ns != NULL) ? attr->ns->prefix : NULL;

	if (fullelemname != NULL) {
	    attrDecl = xmlGetDtdQAttrDesc(doc->intSubset, fullelemname,
		                          attr->name, aprefix);
	    if ((attrDecl == NULL) && (doc->extSubset != NULL))
		attrDecl = xmlGetDtdQAttrDesc(doc->extSubset, fullelemname,
					      attr->name, aprefix);
	}

	if ((fullelemname != felem) && (fullelemname != elem->name))
	    xmlFree(fullelemname);

        if ((attrDecl != NULL) && (attrDecl->atype == XML_ATTRIBUTE_ID))
	    return(1);
    }

    return(0);
}